

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::AndroidPowerConfig::~AndroidPowerConfig(AndroidPowerConfig *this)

{
  ~AndroidPowerConfig(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

AndroidPowerConfig::~AndroidPowerConfig() = default;